

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O0

void pop_sorted_suite::pop_decreasing(void)

{
  iterator pvVar1;
  iterator pvVar2;
  iterator pvVar3;
  iterator pvVar4;
  iterator pvVar5;
  undefined1 local_68 [8];
  array<int,_4UL> expect_3;
  array<int,_4UL> expect_2;
  array<int,_4UL> expect_1;
  array<int,_4UL> expect;
  iterator first;
  iterator last;
  array<int,_4UL> storage;
  
  last = (iterator)0x160000000b;
  storage._M_elems[0] = 0x21;
  storage._M_elems[1] = 0x2c;
  pvVar1 = std::array<int,_4UL>::end((array<int,_4UL> *)&last);
  vista::pop_sorted<int*>(pvVar1 + -1,pvVar1);
  expect_1._M_elems[2] = 0xb;
  expect_1._M_elems[3] = 0x16;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  pvVar3 = std::array<int,_4UL>::end((array<int,_4UL> *)&last);
  pvVar4 = std::array<int,_4UL>::begin((array<int,_4UL> *)(expect_1._M_elems + 2));
  pvVar5 = std::array<int,_4UL>::end((array<int,_4UL> *)(expect_1._M_elems + 2));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x540,"void pop_sorted_suite::pop_decreasing()",pvVar2,pvVar3,pvVar4,pvVar5);
  vista::pop_sorted<int*>(pvVar1 + -2,pvVar1 + -1);
  expect_2._M_elems[2] = 0xb;
  expect_2._M_elems[3] = 0x16;
  expect_1._M_elems[0] = 0x21;
  expect_1._M_elems[1] = 0x2c;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  pvVar3 = std::array<int,_4UL>::end((array<int,_4UL> *)&last);
  pvVar4 = std::array<int,_4UL>::begin((array<int,_4UL> *)(expect_2._M_elems + 2));
  pvVar5 = std::array<int,_4UL>::end((array<int,_4UL> *)(expect_2._M_elems + 2));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x548,"void pop_sorted_suite::pop_decreasing()",pvVar2,pvVar3,pvVar4,pvVar5);
  vista::pop_sorted<int*>(pvVar1 + -3,pvVar1 + -2);
  expect_3._M_elems[2] = 0xb;
  expect_3._M_elems[3] = 0x16;
  expect_2._M_elems[0] = 0x21;
  expect_2._M_elems[1] = 0x2c;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  pvVar3 = std::array<int,_4UL>::end((array<int,_4UL> *)&last);
  pvVar4 = std::array<int,_4UL>::begin((array<int,_4UL> *)(expect_3._M_elems + 2));
  pvVar5 = std::array<int,_4UL>::end((array<int,_4UL> *)(expect_3._M_elems + 2));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x550,"void pop_sorted_suite::pop_decreasing()",pvVar2,pvVar3,pvVar4,pvVar5);
  vista::pop_sorted<int*>(pvVar1 + -4,pvVar1 + -3);
  local_68._0_4_ = 0xb;
  local_68._4_4_ = 0x16;
  expect_3._M_elems[0] = 0x21;
  expect_3._M_elems[1] = 0x2c;
  pvVar1 = std::array<int,_4UL>::begin((array<int,_4UL> *)&last);
  pvVar2 = std::array<int,_4UL>::end((array<int,_4UL> *)&last);
  pvVar3 = std::array<int,_4UL>::begin((array<int,_4UL> *)local_68);
  pvVar4 = std::array<int,_4UL>::end((array<int,_4UL> *)local_68);
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x558,"void pop_sorted_suite::pop_decreasing()",pvVar1,pvVar2,pvVar3,pvVar4);
  return;
}

Assistant:

void pop_decreasing()
{
    std::array<int, 4> storage = { 11, 22, 33, 44 };
    auto last = storage.end();
    auto first = last - 1;
    pop_sorted(first, last);
    {
        std::array<int, 4> expect = { 11, 22, 33, 44 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
    --first;
    --last;
    pop_sorted(first, last);
    {
        std::array<int, 4> expect = { 11, 22, 33, 44 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
    --first;
    --last;
    pop_sorted(first, last);
    {
        std::array<int, 4> expect = { 11, 22, 33, 44 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
    --first;
    --last;
    pop_sorted(first, last);
    {
        std::array<int, 4> expect = { 11, 22, 33, 44 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
}